

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O2

void output_list_to_stdout(uint32_t *list,uint32_t n)

{
  ulong uVar1;
  
  printf("%u\n");
  for (uVar1 = 0; n != uVar1; uVar1 = uVar1 + 1) {
    printf("%u\n",(ulong)list[uVar1]);
  }
  return;
}

Assistant:

void output_list_to_stdout(uint32_t* list, uint32_t n)
{
    printf("%u\n", n);
    for (uint32_t j = 0; j < n; j++) {
        printf("%u\n", list[j]);
    }
}